

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::add_argument_buffer_padding_buffer_type
          (CompilerMSL *this,SPIRType *struct_type,uint32_t *mbr_idx,uint32_t *arg_buff_index,
          MSLResourceBinding *rez_bind)

{
  uint32_t id;
  SPIRType *pSVar1;
  SPIRType *this_00;
  uint32_t rez_idx;
  uint uVar2;
  
  if (this->argument_buffer_padding_buffer_type_id == 0) {
    id = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,2);
    pSVar1 = Compiler::set<spirv_cross::SPIRType>((Compiler *)this,id);
    *(BaseType *)&(pSVar1->super_IVariant).field_0xc = rez_bind->basetype;
    pSVar1->storage = StorageClassUniformConstant;
    this_00 = Compiler::set<spirv_cross::SPIRType>((Compiler *)this,id + 1);
    SPIRType::operator=(this_00,pSVar1);
    this_00->pointer = true;
    this_00->pointer_depth = this_00->pointer_depth + 1;
    (this_00->parent_type).id = id;
    this->argument_buffer_padding_buffer_type_id = id + 1;
  }
  for (uVar2 = 0; uVar2 < rez_bind->count; uVar2 = uVar2 + 1) {
    add_argument_buffer_padding_type
              (this,this->argument_buffer_padding_buffer_type_id,struct_type,mbr_idx,arg_buff_index,
               1);
  }
  return;
}

Assistant:

void CompilerMSL::add_argument_buffer_padding_buffer_type(SPIRType &struct_type, uint32_t &mbr_idx,
                                                          uint32_t &arg_buff_index, MSLResourceBinding &rez_bind)
{
	if (!argument_buffer_padding_buffer_type_id)
	{
		uint32_t buff_type_id = ir.increase_bound_by(2);
		auto &buff_type = set<SPIRType>(buff_type_id);
		buff_type.basetype = rez_bind.basetype;
		buff_type.storage = StorageClassUniformConstant;

		uint32_t ptr_type_id = buff_type_id + 1;
		auto &ptr_type = set<SPIRType>(ptr_type_id);
		ptr_type = buff_type;
		ptr_type.pointer = true;
		ptr_type.pointer_depth++;
		ptr_type.parent_type = buff_type_id;

		argument_buffer_padding_buffer_type_id = ptr_type_id;
	}

	for (uint32_t rez_idx = 0; rez_idx < rez_bind.count; rez_idx++)
		add_argument_buffer_padding_type(argument_buffer_padding_buffer_type_id, struct_type, mbr_idx, arg_buff_index, 1);
}